

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O0

void gz_uncompress(gzFile in,FILE *out)

{
  int iVar1;
  char *msg;
  size_t sVar2;
  undefined1 local_4020 [4];
  uint local_401c;
  int err;
  int len;
  char buf [16384];
  FILE *out_local;
  gzFile in_local;
  
  buf._16376_8_ = out;
  while( true ) {
    local_401c = gzread(in,&err,0x4000);
    if ((int)local_401c < 0) {
      msg = (char *)gzerror(in,local_4020);
      error(msg);
    }
    if (local_401c == 0) break;
    sVar2 = fwrite(&err,1,(ulong)local_401c,(FILE *)buf._16376_8_);
    if ((uint)sVar2 != local_401c) {
      error("failed fwrite");
    }
  }
  iVar1 = fclose((FILE *)buf._16376_8_);
  if (iVar1 != 0) {
    error("failed fclose");
  }
  iVar1 = gzclose(in);
  if (iVar1 != 0) {
    error("failed gzclose");
  }
  return;
}

Assistant:

void gz_uncompress(in, out)
    gzFile in;
    FILE   *out;
{
    local char buf[BUFLEN];
    int len;
    int err;

    for (;;) {
        len = gzread(in, buf, sizeof(buf));
        if (len < 0) error (gzerror(in, &err));
        if (len == 0) break;

        if ((int)fwrite(buf, 1, (unsigned)len, out) != len) {
            error("failed fwrite");
        }
    }
    if (fclose(out)) error("failed fclose");

    if (gzclose(in) != Z_OK) error("failed gzclose");
}